

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O3

bool __thiscall
QGraphicsAnchorLayoutPrivate::replaceVertex
          (QGraphicsAnchorLayoutPrivate *this,Orientation orientation,AnchorVertex *oldV,
          AnchorVertex *newV,QList<QtGraphicsAnchorLayout::AnchorData_*> *edges)

{
  AnchorData *newAnchor;
  long lVar1;
  QPodArrayOps<QtGraphicsAnchorLayout::AnchorData*> *this_00;
  AnchorData *pAVar2;
  AnchorVertex *second;
  ulong uVar3;
  long in_FS_OFFSET;
  bool newFeasible;
  bool local_61;
  bool local_41;
  AnchorData *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((edges->d).size == 0) {
    local_61 = true;
  }
  else {
    lVar1 = (long)(int)orientation;
    this_00 = (QPodArrayOps<QtGraphicsAnchorLayout::AnchorData*> *)
              ((this->simplifiedVertices).m_data + lVar1 + 1);
    local_61 = true;
    uVar3 = 0;
    do {
      newAnchor = (edges->d).ptr[uVar3];
      second = newAnchor->from;
      if (second == oldV) {
        newAnchor->from = newV;
        second = newAnchor->to;
      }
      else {
        newAnchor->to = newV;
      }
      local_41 = true;
      pAVar2 = addAnchorMaybeParallel(this,newAnchor,&local_41);
      local_61 = (bool)(local_61 & local_41);
      if (pAVar2 != newAnchor) {
        local_40 = pAVar2;
        QtPrivate::QPodArrayOps<QtGraphicsAnchorLayout::AnchorData*>::
        emplace<QtGraphicsAnchorLayout::AnchorData*&>
                  (this_00,(this->simplifiedVertices).m_data[lVar1 + 1].d.size,&local_40);
        QList<QtGraphicsAnchorLayout::AnchorData_*>::end
                  ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)this_00);
      }
      Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::takeEdge
                ((this->graph).m_data + lVar1 + -1,oldV,second);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)(edges->d).size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_61;
}

Assistant:

bool QGraphicsAnchorLayoutPrivate::replaceVertex(Qt::Orientation orientation, AnchorVertex *oldV,
                                                 AnchorVertex *newV, const QList<AnchorData *> &edges)
{
    Graph<AnchorVertex, AnchorData> &g = graph[orientation];
    bool feasible = true;

    for (int i = 0; i < edges.size(); ++i) {
        AnchorData *ad = edges[i];
        AnchorVertex *otherV = replaceVertex_helper(ad, oldV, newV);

#if defined(QT_DEBUG)
        ad->name = QString::fromLatin1("%1 --to--> %2").arg(ad->from->toString(), ad->to->toString());
#endif

        bool newFeasible;
        AnchorData *newAnchor = addAnchorMaybeParallel(ad, &newFeasible);
        feasible &= newFeasible;

        if (newAnchor != ad) {
            // A parallel was created, we mark that in the list of anchors created by vertex
            // simplification. This is needed because we want to restore them in a separate step
            // from the restoration of anchor simplification.
            anchorsFromSimplifiedVertices[orientation].append(newAnchor);
        }

        g.takeEdge(oldV, otherV);
    }

    return feasible;
}